

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O3

void freevalue(MOJOSHADER_effectValue *value,MOJOSHADER_free f,void *d)

{
  ulong uVar1;
  long lVar2;
  
  (*f)(value->name,d);
  (*f)(value->semantic,d);
  freetypeinfo(&value->type,f,d);
  if (((value->type).parameter_type - MOJOSHADER_SYMTYPE_SAMPLER < 5) && (value->value_count != 0))
  {
    lVar2 = 8;
    uVar1 = 0;
    do {
      freevalue((MOJOSHADER_effectValue *)((long)(value->field_4).values + lVar2),f,d);
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x48;
    } while (uVar1 < value->value_count);
  }
  (*f)((value->field_4).values,d);
  return;
}

Assistant:

void freevalue(MOJOSHADER_effectValue *value, MOJOSHADER_free f, void *d)
{
    int i;
    f((void *) value->name, d);
    f((void *) value->semantic, d);
    freetypeinfo(&value->type, f, d);
    if (value->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER
     || value->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER1D
     || value->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER2D
     || value->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER3D
     || value->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)
        for (i = 0; i < value->value_count; i++)
            freevalue(&value->valuesSS[i].value, f, d);
    f(value->values, d);
}